

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall Dialog::on_mouse_button_down(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  Widget *pWVar1;
  int iVar2;
  Widget *pWVar3;
  
  if (event->button == 1) {
    check_mouse_over(this,event->x,event->y);
    pWVar3 = this->mouse_over_widget;
    if (pWVar3 != (Widget *)0x0) {
      this->mouse_down_widget = pWVar3;
      (*pWVar3->_vptr_Widget[6])(pWVar3,(ulong)(uint)event->x,(ulong)(uint)event->y);
      pWVar3 = this->mouse_down_widget;
      pWVar1 = this->key_widget;
      if (pWVar3 != pWVar1) {
        if (pWVar1 != (Widget *)0x0) {
          (*pWVar1->_vptr_Widget[0xc])(pWVar1);
          this->key_widget = (Widget *)0x0;
          pWVar3 = this->mouse_down_widget;
        }
        iVar2 = (*pWVar3->_vptr_Widget[10])();
        if ((char)iVar2 != '\0') {
          this->key_widget = this->mouse_down_widget;
          (*this->mouse_down_widget->_vptr_Widget[0xb])();
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Dialog::on_mouse_button_down(const ALLEGRO_MOUSE_EVENT & event)
{
   if (event.button != 1)
      return;

   /* With touch input we may not receive mouse axes event before the touch
    * so we must check which widget the touch is over.
    */
   this->check_mouse_over(event.x, event.y);
   if (!this->mouse_over_widget)
      return;

   this->mouse_down_widget = this->mouse_over_widget;
   this->mouse_down_widget->on_mouse_button_down(event.x, event.y);

   /* transfer key focus */
   if (this->mouse_down_widget != this->key_widget) {
      if (this->key_widget) {
         this->key_widget->lost_key_focus();
         this->key_widget = NULL;
      }
      if (this->mouse_down_widget->want_key_focus()) {
         this->key_widget = this->mouse_down_widget;
         this->key_widget->got_key_focus();
      }
   }
}